

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestMacros.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_30852::TestFixtureCtorThrowsFixtureCtorThrowsTestName::RunImpl
          (TestFixtureCtorThrowsFixtureCtorThrowsTestName *this)

{
  undefined8 *puVar1;
  MemoryOutStream stream;
  
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "exception";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

TEST_FIXTURE_EX(FixtureCtorThrows, FixtureCtorThrowsTestName, throwingFixtureTestList1)
{
}